

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  string local_188;
  uint local_164;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string error;
  string version;
  value_type local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  allocator local_49;
  string local_48;
  char *local_28;
  char *ninjaCommand;
  cmMakefile *mf_local;
  cmGlobalNinjaGenerator *this_local;
  
  ninjaCommand = (char *)mf;
  mf_local = (cmMakefile *)this;
  bVar1 = cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  pcVar2 = ninjaCommand;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"CMAKE_MAKE_PROGRAM",&local_49);
    pcVar2 = cmMakefile::GetDefinition((cmMakefile *)pcVar2,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (pcVar2 != (char *)0x0) {
      local_28 = pcVar2;
      std::__cxx11::string::operator=((string *)&this->NinjaCommand,pcVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78,&this->NinjaCommand);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,"--version",(allocator *)(version.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_e0);
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_78,(string *)(error.field_2._M_local_buf + 8),(string *)local_e0,
                         (int *)0x0,(char *)0x0,OUTPUT_NONE,0.0,Auto);
      pcVar2 = ninjaCommand;
      if (bVar1) {
        cmSystemTools::TrimWhitespace(&local_188,(string *)((long)&error.field_2 + 8));
        std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        CheckNinjaFeatures(this);
      }
      else {
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_160,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,"\' \'");
        std::operator+(&local_140,"Running\n \'",&local_160);
        std::operator+(&local_120,&local_140,"\'\nfailed with:\n ");
        std::operator+(&local_100,&local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        cmMakefile::IssueMessage((cmMakefile *)pcVar2,FATAL_ERROR,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 0;
      }
      local_164 = (uint)!bVar1;
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      if (local_164 != 0) goto LAB_0073d872;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0073d872:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (!this->cmGlobalGenerator::FindMakeProgram(mf)) {
    return false;
  }
  if (const char* ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM")) {
    this->NinjaCommand = ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.push_back("--version");
    std::string version;
    std::string error;
    if (!cmSystemTools::RunSingleCommand(command, &version, &error, CM_NULLPTR,
                                         CM_NULLPTR,
                                         cmSystemTools::OUTPUT_NONE)) {
      mf->IssueMessage(cmake::FATAL_ERROR, "Running\n '" +
                         cmJoin(command, "' '") + "'\n"
                                                  "failed with:\n " +
                         error);
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
    this->NinjaVersion = cmSystemTools::TrimWhitespace(version);
    this->CheckNinjaFeatures();
  }
  return true;
}